

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O3

Vector3f __thiscall
Vector3f::cubicInterpolate
          (Vector3f *this,Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector3f VVar17;
  
  fVar3 = t + 1.0;
  fVar4 = p1->m_elements[2];
  fVar1 = p2->m_elements[2];
  fVar5 = t + -1.0;
  fVar2 = p3->m_elements[2];
  fVar8 = (fVar1 - fVar4) * t + fVar4;
  fVar11 = (fVar4 - p0->m_elements[2]) * fVar3 + p0->m_elements[2];
  fVar7 = fVar3 * 0.5;
  fVar6 = t * 0.5;
  fVar11 = (fVar8 - fVar11) * fVar7 + fVar11;
  fVar12 = (float)*(undefined8 *)p2->m_elements;
  fVar14 = (float)((ulong)*(undefined8 *)p2->m_elements >> 0x20);
  fVar9 = (float)*(undefined8 *)p1->m_elements;
  fVar10 = (float)((ulong)*(undefined8 *)p1->m_elements >> 0x20);
  VVar17.m_elements[1] = t;
  VVar17.m_elements[0] = t;
  fVar13 = (fVar12 - fVar9) * t + fVar9;
  fVar15 = (fVar14 - fVar10) * t + fVar10;
  fVar16 = (float)*(undefined8 *)p0->m_elements;
  fVar4 = (float)((ulong)*(undefined8 *)p0->m_elements >> 0x20);
  VVar17.m_elements[2] = fVar3 * (fVar9 - fVar16) + fVar16;
  fVar4 = fVar3 * (fVar10 - fVar4) + fVar4;
  fVar3 = fVar7 * (fVar13 - VVar17.m_elements[2]) + VVar17.m_elements[2];
  fVar4 = fVar7 * (fVar15 - fVar4) + fVar4;
  *(ulong *)this->m_elements =
       CONCAT44(((fVar6 * ((fVar5 * ((float)((ulong)*(undefined8 *)p3->m_elements >> 0x20) - fVar14)
                           + fVar14) - fVar15) + fVar15) - fVar4) * t + fVar4,
                ((fVar6 * ((fVar5 * ((float)*(undefined8 *)p3->m_elements - fVar12) + fVar12) -
                          fVar13) + fVar13) - fVar3) * t + fVar3);
  this->m_elements[2] =
       (((((fVar2 - fVar1) * fVar5 + fVar1) - fVar8) * fVar6 + fVar8) - fVar11) * t + fVar11;
  return (Vector3f)VVar17.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}